

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_block.cpp
# Opt level: O3

unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true> __thiscall
duckdb::SortedBlock::CreateSlice(SortedBlock *this,idx_t start,idx_t end,idx_t *entry_idx)

{
  BufferManager *buffer_manager;
  GlobalSortState *state;
  pointer this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::SortedData_*,_false> _Var1;
  _Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_> _Var2;
  _Head_base<0UL,_duckdb::SortedData_*,_false> _Var3;
  SortedBlock *this_02;
  pointer pSVar4;
  reference pvVar5;
  pointer pRVar6;
  pointer pSVar7;
  pointer *__ptr;
  pointer *__ptr_2;
  pointer in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  idx_t end_entry_index;
  idx_t end_block_index;
  idx_t start_entry_index;
  idx_t start_block_index;
  _Head_base<0UL,_duckdb::SortedData_*,_false> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  pointer local_68;
  pointer local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50;
  undefined1 uStack_4f;
  undefined6 uStack_4e;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  idx_t *local_40;
  pointer local_38;
  
  local_68 = in_R8;
  local_40 = entry_idx;
  local_38 = (pointer)end;
  GlobalToLocalIndex((SortedBlock *)start,(idx_t *)&stack0xffffffffffffffc8,
                     (idx_t *)&stack0xffffffffffffffb8,(idx_t *)&stack0xffffffffffffffb0);
  GlobalToLocalIndex((SortedBlock *)start,(idx_t *)&stack0xffffffffffffffc0,
                     (idx_t *)&stack0xffffffffffffffa8,(idx_t *)&stack0xffffffffffffffa0);
  buffer_manager = *(BufferManager **)(start + 0x28);
  state = *(GlobalSortState **)(start + 0x30);
  this_02 = (SortedBlock *)operator_new(0x48);
  SortedBlock(this_02,buffer_manager,state);
  (this->radix_sorting_data).
  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_02;
  local_70._M_pi = local_58;
  p_Var8 = local_48;
  if (local_48 <= local_58) {
    do {
      pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                           *)this);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                             *)start,(size_type)p_Var8);
      unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::operator->
                (pvVar5);
      RowDataBlock::Copy((RowDataBlock *)&stack0xffffffffffffff88);
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                  *)pSVar4,
                 (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  *)&stack0xffffffffffffff88);
      _Var2.super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::RowDataBlock_*,_false>)
           (_Head_base<0UL,_duckdb::RowDataBlock_*,_false>)local_78._M_head_impl;
      if (local_78._M_head_impl != (SortedData *)0x0) {
        this_00 = (((RowLayout *)((long)local_78._M_head_impl + 8))->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (this_00 != (pointer)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        operator_delete((void *)_Var2.super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>.
                                _M_head_impl);
      }
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var8->_vptr__Sp_counted_base + 1);
    } while (p_Var8 <= local_70._M_pi);
    if (local_48 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_015d3e3d;
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                           *)start,(size_type)p_Var8);
    pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar5);
    this_01 = (pRVar6->block).internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (pRVar6->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (pRVar6->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&p_Var8->_vptr__Sp_counted_base + 1);
  } while (local_48 != p_Var8);
LAB_015d3e3d:
  local_68->id_ = local_50;
  local_68->physical_type_ = uStack_4f;
  *(undefined6 *)&local_68->field_0x2 = uStack_4e;
  pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
           operator->((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                       *)this);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back(&pSVar4->radix_sorting_data);
  pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(pvVar5);
  pRVar6->count = (idx_t)local_60;
  if (*(char *)(*(long *)(start + 0x38) + 0x50) == '\0') {
    pSVar7 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
             operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                         *)(start + 0x18));
    SortedData::CreateSlice
              ((SortedData *)&stack0xffffffffffffff88,(idx_t)pSVar7,(idx_t)local_48,
               (idx_t)local_70._M_pi);
    pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                         *)this);
    _Var3._M_head_impl = local_78._M_head_impl;
    local_78._M_head_impl = (SortedData *)0x0;
    _Var1._M_head_impl =
         (pSVar4->blob_sorting_data).
         super_unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>._M_t.
         super___uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::SortedData_*,_std::default_delete<duckdb::SortedData>_>.
         super__Head_base<0UL,_duckdb::SortedData_*,_false>._M_head_impl;
    (pSVar4->blob_sorting_data).
    super_unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>._M_t.
    super___uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SortedData_*,_std::default_delete<duckdb::SortedData>_>.
    super__Head_base<0UL,_duckdb::SortedData_*,_false>._M_head_impl = _Var3._M_head_impl;
    if ((_Var1._M_head_impl != (SortedData *)0x0) &&
       (::std::default_delete<duckdb::SortedData>::operator()
                  ((default_delete<duckdb::SortedData> *)&pSVar4->blob_sorting_data,
                   _Var1._M_head_impl),
       (_Head_base<0UL,_duckdb::RowDataBlock_*,_false>)local_78._M_head_impl !=
       (_Head_base<0UL,_duckdb::RowDataBlock_*,_false>)0x0)) {
      ::std::default_delete<duckdb::SortedData>::operator()
                ((default_delete<duckdb::SortedData> *)&stack0xffffffffffffff88,
                 local_78._M_head_impl);
    }
  }
  pSVar7 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator->
                     ((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                       *)(start + 0x20));
  SortedData::CreateSlice
            ((SortedData *)&stack0xffffffffffffff88,(idx_t)pSVar7,(idx_t)local_48,
             (idx_t)local_70._M_pi);
  pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
           operator->((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                       *)this);
  _Var3._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SortedData *)0x0;
  _Var1._M_head_impl =
       (pSVar4->payload_data).
       super_unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>._M_t.
       super___uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SortedData_*,_std::default_delete<duckdb::SortedData>_>.
       super__Head_base<0UL,_duckdb::SortedData_*,_false>._M_head_impl;
  (pSVar4->payload_data).
  super_unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>._M_t.
  super___uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SortedData_*,_std::default_delete<duckdb::SortedData>_>.
  super__Head_base<0UL,_duckdb::SortedData_*,_false>._M_head_impl = _Var3._M_head_impl;
  if ((_Var1._M_head_impl != (SortedData *)0x0) &&
     (::std::default_delete<duckdb::SortedData>::operator()
                ((default_delete<duckdb::SortedData> *)&pSVar4->payload_data,_Var1._M_head_impl),
     (_Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>)
     local_78._M_head_impl != (RowDataBlock *)0x0)) {
    ::std::default_delete<duckdb::SortedData>::operator()
              ((default_delete<duckdb::SortedData> *)&stack0xffffffffffffff88,local_78._M_head_impl)
    ;
  }
  return (unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>)
         (unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>)this;
}

Assistant:

unique_ptr<SortedBlock> SortedBlock::CreateSlice(const idx_t start, const idx_t end, idx_t &entry_idx) {
	// Identify blocks/entry indices of this slice
	idx_t start_block_index;
	idx_t start_entry_index;
	GlobalToLocalIndex(start, start_block_index, start_entry_index);
	idx_t end_block_index;
	idx_t end_entry_index;
	GlobalToLocalIndex(end, end_block_index, end_entry_index);
	// Add the corresponding blocks to the result
	auto result = make_uniq<SortedBlock>(buffer_manager, state);
	for (idx_t i = start_block_index; i <= end_block_index; i++) {
		result->radix_sorting_data.push_back(radix_sorting_data[i]->Copy());
	}
	// Reset all blocks that come before block with idx = start_block_idx (slice holds new reference)
	for (idx_t i = 0; i < start_block_index; i++) {
		radix_sorting_data[i]->block = nullptr;
	}
	// Use start and end entry indices to set the boundaries
	entry_idx = start_entry_index;
	D_ASSERT(end_entry_index <= result->radix_sorting_data.back()->count);
	result->radix_sorting_data.back()->count = end_entry_index;
	// Same for the var size sorting data
	if (!sort_layout.all_constant) {
		result->blob_sorting_data = blob_sorting_data->CreateSlice(start_block_index, end_block_index, end_entry_index);
	}
	// And the payload data
	result->payload_data = payload_data->CreateSlice(start_block_index, end_block_index, end_entry_index);
	return result;
}